

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

void __thiscall
QItemDelegate::drawDisplay
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect,
          QString *text)

{
  TextElideMode TVar1;
  bool bVar2;
  Int IVar3;
  Int IVar4;
  int iVar5;
  int iVar6;
  QItemDelegatePrivate *this_00;
  QWidget *pQVar7;
  qsizetype qVar8;
  QBrush *in_RCX;
  QStyleOptionViewItem *in_RDX;
  WrapMode wrap;
  QRect *in_RSI;
  longlong in_R8;
  long in_FS_OFFSET;
  qreal qVar9;
  double dVar10;
  int end;
  int start;
  bool wrapText;
  int textMargin;
  QStyle *style;
  QWidget *widget;
  ColorGroup cg;
  QItemDelegatePrivate *d;
  QRect layoutRect;
  QSize layoutSize;
  QString elided;
  QSizeF textLayoutSize;
  QRect textRect;
  QStyleOptionViewItem opt;
  ColorRole in_stack_fffffffffffffbe8;
  CaseSensitivity in_stack_fffffffffffffbec;
  QStyleOptionViewItem *in_stack_fffffffffffffbf0;
  QRect *in_stack_fffffffffffffbf8;
  QRectF *in_stack_fffffffffffffc00;
  QRectF *this_01;
  QItemDelegatePrivate *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc24;
  QItemDelegatePrivate *in_stack_fffffffffffffc28;
  LayoutDirection in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc58;
  QFontMetrics *pQVar11;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QStyle *local_360;
  bool local_31d;
  int local_31c;
  ColorRole local_2f4;
  undefined1 local_2a0 [24];
  QPoint local_288;
  undefined1 local_280 [48];
  undefined1 local_250 [24];
  QPoint local_238;
  undefined1 local_230 [20];
  Int local_21c;
  undefined1 local_218 [16];
  undefined1 *local_208;
  QSizeF local_200;
  undefined1 local_1f0 [24];
  undefined1 local_1d8 [28];
  QChar local_1bc;
  QChar local_1ba;
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [24];
  undefined1 local_188 [30];
  QChar local_16a;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  QSizeF local_150 [4];
  Int local_110;
  QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4> local_10c;
  undefined1 local_108 [16];
  QRect local_f8;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_e8;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_e4;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_e0;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_dc;
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QItemDelegate *)0x8545b9);
  local_dc.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_dc);
  local_2f4 = (ColorRole)(IVar3 == 0);
  local_31d = false;
  if (local_2f4 == WindowText) {
    local_e0.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec
                   );
    local_31d = QFlags<QStyle::StateFlag>::operator!((QFlags<QStyle::StateFlag> *)&local_e0);
  }
  if (local_31d != false) {
    local_2f4 = Light;
  }
  local_e4.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_e4);
  iVar6 = (int)in_RDX;
  if (IVar3 == 0) {
    QPalette::color((QPalette *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
                    in_stack_fffffffffffffbe8);
    QPainter::setPen((QColor *)in_RSI);
  }
  else {
    QPalette::brush(iVar6 + 0x28,local_2f4);
    QPainter::fillRect((QRect *)in_RSI,in_RCX);
    QPalette::color((QPalette *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
                    in_stack_fffffffffffffbe8);
    QPainter::setPen((QColor *)in_RSI);
  }
  bVar2 = QString::isEmpty((QString *)0x85476e);
  if (bVar2) goto LAB_0085520b;
  local_e8.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_e8);
  if (IVar3 != 0) {
    QPainter::save();
    QPalette::color((QPalette *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
                    in_stack_fffffffffffffbe8);
    QPainter::setPen((QColor *)in_RSI);
    local_f8 = QRect::adjusted((QRect *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,
                               in_stack_fffffffffffffc20,
                               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                               (int)in_stack_fffffffffffffc18);
    QPainter::drawRect((QPainter *)in_stack_fffffffffffffbf0,
                       (QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QPainter::restore();
  }
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem
            (in_stack_fffffffffffffbf0,
             (QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  pQVar7 = QItemDelegatePrivate::widget(this_00,in_RDX);
  if (pQVar7 == (QWidget *)0x0) {
    local_360 = QApplication::style();
  }
  else {
    local_360 = QWidget::style((QWidget *)
                               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  }
  (**(code **)(*(long *)local_360 + 0xe0))(local_360,0x41,0,pQVar7);
  local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = (undefined1  [16])
              QRect::adjusted((QRect *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,
                              in_stack_fffffffffffffc20,
                              (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                              (int)in_stack_fffffffffffffc18);
  local_10c.super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
       (QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>)
       QFlags<QStyleOptionViewItem::ViewItemFeature>::operator&
                 ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)in_stack_fffffffffffffbf0,
                  in_stack_fffffffffffffbec);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10c);
  wrap = ManualWrap;
  if (IVar4 != 0) {
    wrap = WordWrap;
  }
  QTextOption::setWrapMode(&this_00->textOption,wrap);
  QTextOption::setTextDirection(&this_00->textOption,(in_RDX->super_QStyleOption).direction);
  local_110 = (in_RDX->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
              super_QFlagsStorage<Qt::AlignmentFlag>.i;
  QStyle::visualAlignment
            ((LayoutDirection)in_stack_fffffffffffffbf0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             SUB84((ulong)in_stack_fffffffffffffbf8 >> 0x20,0));
  QTextOption::setAlignment
            ((QTextOption *)in_stack_fffffffffffffbf0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             SUB84((ulong)in_stack_fffffffffffffbf8 >> 0x20,0));
  QTextLayout::setTextOption((QTextOption *)&this_00->textLayout);
  QTextLayout::setFont((QFont *)&this_00->textLayout);
  QString::QString((QString *)in_stack_fffffffffffffbf0,
                   (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  QItemDelegatePrivate::replaceNewLine((QString *)in_stack_fffffffffffffbf8);
  QTextLayout::setText((QString *)&this_00->textLayout);
  QString::~QString((QString *)0x854ad7);
  QString::~QString((QString *)0x854ae4);
  local_150[0].ht = -NAN;
  local_150[0].wd = -NAN;
  QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_150[0] = QItemDelegatePrivate::doTextLayout
                           (in_stack_fffffffffffffc08,
                            (int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
  iVar5 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  qVar9 = QSizeF::width(local_150);
  if ((double)iVar5 < qVar9) {
LAB_00854bb0:
    local_168 = &DAT_aaaaaaaaaaaaaaaa;
    local_160 = &DAT_aaaaaaaaaaaaaaaa;
    local_158 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x854bea);
    QChar::QChar<QChar::SpecialCharacter,_true>(&local_16a,LineSeparator);
    qVar8 = QString::indexOf((QString *)in_stack_fffffffffffffbf8,
                             (QChar)(char16_t)((ulong)in_stack_fffffffffffffc18 >> 0x30),
                             (qsizetype)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
    local_31c = (int)qVar8;
    if (local_31c == -1) {
      pQVar11 = &(in_RDX->super_QStyleOption).fontMetrics;
      TVar1 = in_RDX->textElideMode;
      QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      QFontMetrics::elidedText((QString *)local_188,(TextElideMode)pQVar11,(int)in_R8,TVar1);
      alignment.i = (Int)((ulong)pQVar11 >> 0x20);
      QString::operator+=((QString *)in_stack_fffffffffffffbf0,
                          (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      QString::~QString((QString *)0x854cd1);
    }
    else {
      while (alignment.i = (Int)((ulong)in_stack_fffffffffffffc58 >> 0x20), local_31c != -1) {
        QString::mid((longlong)local_1b8,in_R8);
        TVar1 = in_RDX->textElideMode;
        QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        QFontMetrics::elidedText((QString *)local_1a0,iVar6 + 0x20,(int)local_1b8,TVar1);
        QString::operator+=((QString *)in_stack_fffffffffffffbf0,
                            (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                           );
        QString::~QString((QString *)0x854d87);
        QString::~QString((QString *)0x854d94);
        QChar::QChar<QChar::SpecialCharacter,_true>(&local_1ba,LineSeparator);
        QString::operator+=((QString *)in_stack_fffffffffffffbf0,
                            (QChar)(char16_t)((ulong)in_stack_fffffffffffffbf8 >> 0x30));
        QChar::QChar<QChar::SpecialCharacter,_true>(&local_1bc,LineSeparator);
        qVar8 = QString::indexOf((QString *)in_stack_fffffffffffffbf8,
                                 (QChar)(char16_t)((ulong)in_stack_fffffffffffffc18 >> 0x30),
                                 (qsizetype)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        local_31c = (int)qVar8;
      }
      in_stack_fffffffffffffc30 = iVar6 + 0x20;
      QString::mid((longlong)local_1f0,in_R8);
      TVar1 = in_RDX->textElideMode;
      QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      QFontMetrics::elidedText((QString *)local_1d8,in_stack_fffffffffffffc30,(int)local_1f0,TVar1);
      QString::operator+=((QString *)in_stack_fffffffffffffbf0,
                          (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      QString::~QString((QString *)0x854ead);
      QString::~QString((QString *)0x854eba);
    }
    QTextLayout::setText((QString *)&this_00->textLayout);
    in_stack_fffffffffffffc28 = this_00;
    QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    local_200 = QItemDelegatePrivate::doTextLayout
                          (in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20)
                          );
    local_150[0] = local_200;
    QString::~QString((QString *)0x854f3b);
  }
  else {
    iVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    qVar9 = QSizeF::height(local_150);
    alignment.i = (Int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
    if ((double)iVar5 < qVar9) goto LAB_00854bb0;
  }
  local_208 = &DAT_aaaaaaaaaaaaaaaa;
  iVar6 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  QSizeF::height(local_150);
  QSize::QSize((QSize *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               in_stack_fffffffffffffbe8);
  local_218._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_218._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_21c = (in_RDX->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
              super_QFlagsStorage<Qt::AlignmentFlag>.i;
  local_218 = (undefined1  [16])
              QStyle::alignedRect(in_stack_fffffffffffffc30,(Alignment)alignment.i,
                                  (QSize *)in_stack_fffffffffffffc28,
                                  (QRect *)CONCAT44(iVar6,in_stack_fffffffffffffc20));
  bVar2 = hasClipping((QItemDelegate *)in_stack_fffffffffffffbf0);
  if (bVar2) {
LAB_0085514a:
    in_stack_fffffffffffffbf0 = (QStyleOptionViewItem *)&this_00->textLayout;
    local_288 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8
                                                ));
    QPointF::QPointF((QPointF *)in_stack_fffffffffffffbf0,
                     (QPoint *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    memset(local_2a0,0,0x18);
    QList<QTextLayout::FormatRange>::QList((QList<QTextLayout::FormatRange> *)0x8551b5);
    QRectF::QRectF(in_stack_fffffffffffffc00,in_RSI);
    QTextLayout::draw((QPainter *)in_stack_fffffffffffffbf0,(QPointF *)in_RSI,
                      (QList_conflict2 *)local_280,(QRectF *)local_2a0);
    QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x8551fe);
  }
  else {
    iVar6 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    dVar10 = (double)iVar6;
    qVar9 = QSizeF::width(local_150);
    if (qVar9 <= dVar10) {
      iVar6 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      qVar9 = QSizeF::height(local_150);
      if (qVar9 <= (double)iVar6) goto LAB_0085514a;
    }
    QPainter::save();
    QPainter::setClipRect((QRect *)in_RSI,(ClipOperation)local_218);
    this_01 = (QRectF *)&this_00->textLayout;
    local_238 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8
                                                ));
    QPointF::QPointF((QPointF *)in_stack_fffffffffffffbf0,
                     (QPoint *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    memset(local_250,0,0x18);
    QList<QTextLayout::FormatRange>::QList((QList<QTextLayout::FormatRange> *)0x8550ef);
    QRectF::QRectF(this_01,in_stack_fffffffffffffbf8);
    QTextLayout::draw((QPainter *)this_01,(QPointF *)in_RSI,(QList_conflict2 *)local_230,
                      (QRectF *)local_250);
    QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x855138);
    QPainter::restore();
  }
  QStyleOptionViewItem::~QStyleOptionViewItem(in_stack_fffffffffffffbf0);
LAB_0085520b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawDisplay(QPainter *painter, const QStyleOptionViewItem &option,
                                const QRect &rect, const QString &text) const
{
    Q_D(const QItemDelegate);

    QPalette::ColorGroup cg = option.state & QStyle::State_Enabled
                              ? QPalette::Normal : QPalette::Disabled;
    if (cg == QPalette::Normal && !(option.state & QStyle::State_Active))
        cg = QPalette::Inactive;
    if (option.state & QStyle::State_Selected) {
        painter->fillRect(rect, option.palette.brush(cg, QPalette::Highlight));
        painter->setPen(option.palette.color(cg, QPalette::HighlightedText));
    } else {
        painter->setPen(option.palette.color(cg, QPalette::Text));
    }

    if (text.isEmpty())
        return;

    if (option.state & QStyle::State_Editing) {
        painter->save();
        painter->setPen(option.palette.color(cg, QPalette::Text));
        painter->drawRect(rect.adjusted(0, 0, -1, -1));
        painter->restore();
    }

    const QStyleOptionViewItem opt = option;

    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    const int textMargin = style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, widget) + 1;
    QRect textRect = rect.adjusted(textMargin, 0, -textMargin, 0); // remove width padding
    const bool wrapText = opt.features & QStyleOptionViewItem::WrapText;
    d->textOption.setWrapMode(wrapText ? QTextOption::WordWrap : QTextOption::ManualWrap);
    d->textOption.setTextDirection(option.direction);
    d->textOption.setAlignment(QStyle::visualAlignment(option.direction, option.displayAlignment));
    d->textLayout.setTextOption(d->textOption);
    d->textLayout.setFont(option.font);
    d->textLayout.setText(QItemDelegatePrivate::replaceNewLine(text));

    QSizeF textLayoutSize = d->doTextLayout(textRect.width());

    if (textRect.width() < textLayoutSize.width()
        || textRect.height() < textLayoutSize.height()) {
        QString elided;
        int start = 0;
        int end = text.indexOf(QChar::LineSeparator, start);
        if (end == -1) {
            elided += option.fontMetrics.elidedText(text, option.textElideMode, textRect.width());
        } else {
            while (end != -1) {
                elided += option.fontMetrics.elidedText(text.mid(start, end - start),
                                                        option.textElideMode, textRect.width());
                elided += QChar::LineSeparator;
                start = end + 1;
                end = text.indexOf(QChar::LineSeparator, start);
            }
            //let's add the last line (after the last QChar::LineSeparator)
            elided += option.fontMetrics.elidedText(text.mid(start),
                                                    option.textElideMode, textRect.width());
        }
        d->textLayout.setText(elided);
        textLayoutSize = d->doTextLayout(textRect.width());
    }

    const QSize layoutSize(textRect.width(), int(textLayoutSize.height()));
    const QRect layoutRect = QStyle::alignedRect(option.direction, option.displayAlignment,
                                                  layoutSize, textRect);
    // if we still overflow even after eliding the text, enable clipping
    if (!hasClipping() && (textRect.width() < textLayoutSize.width()
                           || textRect.height() < textLayoutSize.height())) {
        painter->save();
        painter->setClipRect(layoutRect);
        d->textLayout.draw(painter, layoutRect.topLeft(), QList<QTextLayout::FormatRange>(),
                           layoutRect);
        painter->restore();
    } else {
        d->textLayout.draw(painter, layoutRect.topLeft(), QList<QTextLayout::FormatRange>(),
                           layoutRect);
    }
}